

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O0

void set_icon(GLFWwindow *window,int icon_color)

{
  undefined1 local_440 [8];
  GLFWimage img;
  uchar *target;
  uchar pixels [1024];
  int local_1c;
  int local_18;
  int y;
  int x;
  int icon_color_local;
  GLFWwindow *window_local;
  
  img.pixels = (uchar *)&target;
  local_440._0_4_ = 0x10;
  local_440._4_4_ = 0x10;
  img._0_8_ = &target;
  for (local_1c = 0; local_1c < (int)local_440._0_4_; local_1c = local_1c + 1) {
    for (local_18 = 0; local_18 < (int)local_440._4_4_; local_18 = local_18 + 1) {
      if (logo[local_1c][local_18] == '0') {
        *(uchar (*) [4])img.pixels = icon_colors[icon_color];
      }
      else {
        memset(img.pixels,0,4);
      }
      img.pixels = img.pixels + 4;
    }
  }
  glfwSetWindowIcon(window,1,(GLFWimage *)local_440);
  return;
}

Assistant:

static void set_icon(GLFWwindow* window, int icon_color)
{
    int x, y;
    unsigned char pixels[16 * 16 * 4];
    unsigned char* target = pixels;
    GLFWimage img = { 16, 16, pixels };

    for (y = 0;  y < img.width;  y++)
    {
        for (x = 0;  x < img.height;  x++)
        {
            if (logo[y][x] == '0')
                memcpy(target, icon_colors[icon_color], 4);
            else
                memset(target, 0, 4);

            target += 4;
        }
    }

    glfwSetWindowIcon(window, 1, &img);
}